

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void Cmd_toggle(FCommandLine *argv,APlayerPawn *who,int key)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  char *pcVar4;
  UCVarValue local_38;
  UCVarValue val;
  FBaseCVar *prev;
  FBaseCVar *var;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  var._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar2 = FCommandLine::argc(argv);
  if (1 < iVar2) {
    pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    prev = FindCVar(pcVar3,(FBaseCVar **)&val.pGUID);
    if (prev != (FBaseCVar *)0x0) {
      iVar2 = (*prev->_vptr_FBaseCVar[4])(prev,0);
      local_38._0_1_ = (undefined1)iVar2;
      local_38._1_7_ = (undefined7)(CONCAT44(extraout_var,iVar2) >> 8);
      uVar1 = CONCAT71(local_38._1_7_,local_38._0_1_) ^ 0xff;
      local_38.String = (char *)(uVar1 & 0xffffffffffffff01);
      FBaseCVar::SetGenericRep(prev,local_38,CVAR_Bool);
      pcVar3 = FBaseCVar::GetName(prev);
      pcVar4 = "false";
      if ((uVar1 & 1) != 0) {
        pcVar4 = "true";
      }
      Printf("\"%s\" is \"%s\"\n",pcVar3,pcVar4);
    }
  }
  return;
}

Assistant:

CCMD (toggle)
{
	FBaseCVar *var, *prev;
	UCVarValue val;

	if (argv.argc() > 1)
	{
		if ( (var = FindCVar (argv[1], &prev)) )
		{
			val = var->GetGenericRep (CVAR_Bool);
			val.Bool = !val.Bool;
			var->SetGenericRep (val, CVAR_Bool);
			Printf ("\"%s\" is \"%s\"\n", var->GetName(),
				val.Bool ? "true" : "false");
		}
	}
}